

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_List.h
# Opt level: O2

Iterator __thiscall
axl::sl::
ListBase<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ListLink>_>_>
::insertTail(ListBase<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ListLink>_>_>
             *this,HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>
                   *p)

{
  size_t *psVar1;
  HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()> *pHVar2;
  ListLink *link;
  
  pHVar2 = (this->
           super_ListData<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>_>
           ).m_tail;
  (p->super_MapEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>).
  super_ListLink.m_next = (ListLink *)0x0;
  (p->super_MapEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>).
  super_ListLink.m_prev = (ListLink *)pHVar2;
  if (pHVar2 == (HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>
                 *)0x0) {
    pHVar2 = (HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>
              *)this;
  }
  (pHVar2->super_MapEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>)
  .super_ListLink.m_next = (ListLink *)p;
  (this->
  super_ListData<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>_>
  ).m_tail = p;
  psVar1 = &(this->
            super_ListData<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>_>
            ).m_count;
  *psVar1 = *psVar1 + 1;
  return (IteratorImpl<axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ListLink>_>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ListLink>_>
          )(IteratorImpl<axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ListLink>_>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ListLink>_>
            )p;
}

Assistant:

Iterator
	insertTail(T* p) {
		ListLink* link = GetLink()(p);
		ListLink* tailLink = Iterator::getLinkFromEntry(this->m_tail);

		link->m_next = NULL;
		link->m_prev = tailLink;

		if (tailLink)
			tailLink->m_next = link;
		else
			this->m_head = p;

		this->m_tail = p;
		this->m_count++;

		return p;
	}